

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.cpp
# Opt level: O1

MPP_RET __thiscall
RcImplApiService::api_get_by_type
          (RcImplApiService *this,RcApiBrief *brief,RK_S32 *count,RK_S32 max_count,
          MppCodingType type)

{
  list_head *plVar1;
  list_head *plVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  list_head *plVar4;
  long lVar5;
  
  __mutex = (pthread_mutex_t *)get_lock();
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  plVar4 = (this->mApis).next;
  iVar3 = 0;
  if (0 < max_count && plVar4 != &this->mApis) {
    iVar3 = 0;
    do {
      plVar1 = plVar4->next;
      if (*(MppCodingType *)&plVar4[3].next == type) {
        lVar5 = (long)iVar3;
        iVar3 = iVar3 + 1;
        plVar2 = plVar4[4].next;
        brief[lVar5].name = (char *)plVar4[3].prev;
        *(list_head **)&brief[lVar5].type = plVar2;
      }
    } while ((plVar1 != &this->mApis) && (plVar4 = plVar1, iVar3 < max_count));
  }
  *count = iVar3;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(__mutex);
  }
  return MPP_OK;
}

Assistant:

MPP_RET RcImplApiService::api_get_by_type(RcApiBrief *brief, RK_S32 *count,
                                          RK_S32 max_count, MppCodingType type)
{
    RK_S32 cnt = 0;
    RcImplApiNode *pos, *n;

    AutoMutex auto_lock(get_lock());

    list_for_each_entry_safe(pos, n, &mApis, RcImplApiNode, list) {
        if (cnt >= max_count)
            break;

        if (pos->type != type)
            continue;

        brief[cnt++] = pos->brief;
    }

    *count = cnt;

    return MPP_OK;
}